

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O1

Task * __thiscall
LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
          (LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *this)

{
  __pointer_type pTVar1;
  __pointer_type pTVar2;
  bool bVar3;
  
  pTVar1 = (this->head_)._M_b._M_p;
  do {
    while (pTVar2 = pTVar1, ((ulong)pTVar2 & 0xffffffffffff) == 0) {
      allocate(this);
      pTVar1 = (this->head_)._M_b._M_p;
    }
    LOCK();
    pTVar1 = (this->head_)._M_b._M_p;
    bVar3 = pTVar2 == pTVar1;
    if (bVar3) {
      (this->head_)._M_b._M_p =
           (__pointer_type)
           (((ulong)pTVar2 & 0xffff000000000000 | 0xffffffffffff) +
            (*(ulong *)(((ulong)pTVar2 & 0xffffffffffff) + 0x28) & 0xffffffffffff) + 1);
      pTVar1 = pTVar2;
    }
    UNLOCK();
  } while (!bVar3);
  return (Task *)((ulong)pTVar2 & 0xffffffffffff);
}

Assistant:

T* intl_malloc()
  {
    T* ret = head_.load(std::memory_order_relaxed);
    do {
      while(clean_ptr(ret) == nullptr) {
        allocate();
        ret = head_.load(std::memory_order_relaxed);
      }
    } while(!head_.compare_exchange_weak(ret, next_ptr(clean_ptr(static_cast<T *>(clean_ptr(ret)->next)), ret)));
    
    //Notice that we do not make a new (ret) T()
    return clean_ptr(ret);
  }